

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O3

bool __thiscall libebml::EbmlMaster::VerifyChecksum(EbmlMaster *this)

{
  int iVar1;
  undefined4 extraout_var;
  pointer ppEVar2;
  ulong uVar3;
  bool bVar4;
  MemIOCallback TmpBuf;
  EbmlCrc32 aChecksum;
  MemIOCallback MStack_b8;
  EbmlCrc32 local_68;
  
  bVar4 = true;
  if (this->bChecksumUsed == true) {
    EbmlCrc32::EbmlCrc32(&local_68);
    iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
    MemIOCallback::MemIOCallback(&MStack_b8,CONCAT44(extraout_var,iVar1) - 6);
    ppEVar2 = (this->ElementList).
              super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->ElementList).
        super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppEVar2) {
      uVar3 = 0;
      do {
        EbmlElement::Render(ppEVar2[uVar3],&MStack_b8.super_IOCallback,true,false,true);
        uVar3 = uVar3 + 1;
        ppEVar2 = (this->ElementList).
                  super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar3 < (ulong)((long)(this->ElementList).
                                     super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar2 >> 3
                              ));
    }
    EbmlCrc32::FillCRC32(&local_68,MStack_b8.dataBuffer,(uint32)MStack_b8.dataBufferTotalSize);
    bVar4 = local_68.m_crc_final == (this->Checksum).m_crc_final;
    MemIOCallback::~MemIOCallback(&MStack_b8);
    EbmlBinary::~EbmlBinary(&local_68.super_EbmlBinary);
  }
  return bVar4;
}

Assistant:

bool EbmlMaster::VerifyChecksum() const
{
  if (!bChecksumUsed)
    return true;

  EbmlCrc32 aChecksum;
  /// \todo remove the Checksum if it's in the list
  /// \todo find another way when not all default values are saved or (unknown from the reader !!!)
  MemIOCallback TmpBuf(GetSize() - 6);
  for (size_t Index = 0; Index < ElementList.size(); Index++) {
    (ElementList[Index])->Render(TmpBuf, true, false, true);
  }
  aChecksum.FillCRC32(TmpBuf.GetDataBuffer(), TmpBuf.GetDataBufferSize());
  return (aChecksum.GetCrc32() == Checksum.GetCrc32());
}